

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<ComponentInfo>::reallocateAndGrow
          (QArrayDataPointer<ComponentInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ComponentInfo> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  undefined8 uVar3;
  ComponentInfo *data;
  ComponentInfo *pCVar4;
  long lVar5;
  Data *pDVar6;
  ComponentInfo *pCVar7;
  Int IVar8;
  ComponentInfo *pCVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<ComponentInfo> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = this->d;
  if (pDVar6 == (Data *)0x0) {
    lVar11 = 0;
    lVar5 = this->size;
    if (this->size < 1) {
      lVar5 = lVar11;
    }
    lVar5 = lVar5 + n;
  }
  else {
    lVar11 = (pDVar6->super_QArrayData).alloc;
    lVar5 = this->size;
    lVar12 = lVar5;
    if (lVar5 - lVar11 == 0 || lVar5 < lVar11) {
      lVar12 = lVar11;
    }
    lVar10 = (long)((long)this->ptr -
                   ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             4;
    if (where == GrowsAtEnd) {
      lVar10 = (lVar5 - lVar11) + lVar10 * -0x5555555555555555;
    }
    else {
      lVar10 = lVar10 * 0x5555555555555555;
    }
    lVar10 = lVar12 + n + lVar10;
    lVar5 = lVar10;
    if (lVar10 < lVar11) {
      lVar5 = lVar11;
    }
    if (((pDVar6->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar5 = lVar10;
    }
  }
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pCVar4 = (ComponentInfo *)
           QArrayData::allocate((QArrayData **)&local_48,0x30,0x10,lVar5,(uint)(lVar5 <= lVar11));
  if (pCVar4 != (ComponentInfo *)0x0 && local_48.d != (Data *)0x0) {
    if (where == GrowsAtBeginning) {
      lVar11 = (((local_48.d)->super_QArrayData).alloc - (this->size + n)) / 2;
      IVar8 = 0;
      if (lVar11 < 1) {
        lVar11 = 0;
      }
      pDVar6 = this->d;
      pCVar4 = pCVar4 + n + lVar11;
      if (pDVar6 != (Data *)0x0) {
LAB_0012d1ae:
        IVar8 = (pDVar6->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
    }
    else {
      pDVar6 = this->d;
      if (pDVar6 != (Data *)0x0) {
        pCVar4 = (ComponentInfo *)
                 ((long)pCVar4 +
                 ((long)this->ptr -
                 ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)));
        goto LAB_0012d1ae;
      }
      IVar8 = 0;
    }
    ((local_48.d)->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar8;
  }
  local_48.size = 0;
  lVar11 = this->size;
  if (lVar11 != 0) {
    if ((this->d == (Data *)0x0) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      if (0 < lVar11) {
        pCVar7 = this->ptr;
        pCVar9 = pCVar7 + lVar11;
        do {
          pDVar2 = (pCVar7->name).d.d;
          pCVar4[local_48.size].name.d.d = pDVar2;
          pCVar4[local_48.size].name.d.ptr = (pCVar7->name).d.ptr;
          pCVar4[local_48.size].name.d.size = (pCVar7->name).d.size;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar2 = (pCVar7->path).d.d;
          pCVar4[local_48.size].path.d.d = pDVar2;
          pCVar4[local_48.size].path.d.ptr = (pCVar7->path).d.ptr;
          pCVar4[local_48.size].path.d.size = (pCVar7->path).d.size;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pCVar7 = pCVar7 + 1;
          lVar5 = local_48.size + 1;
          local_48.size = lVar5;
        } while (pCVar7 < pCVar9);
        goto LAB_0012d2eb;
      }
    }
    else if (0 < lVar11) {
      pCVar7 = this->ptr;
      lVar12 = 0;
      lVar5 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pCVar7->name).d.d + lVar12);
        uVar3 = *puVar1;
        *puVar1 = 0;
        *(undefined8 *)((long)&(pCVar4->name).d.d + lVar12) = uVar3;
        uVar3 = puVar1[1];
        puVar1[1] = 0;
        *(undefined8 *)((long)&(pCVar4->name).d.ptr + lVar12) = uVar3;
        uVar3 = puVar1[2];
        puVar1[2] = 0;
        *(undefined8 *)((long)&(pCVar4->name).d.size + lVar12) = uVar3;
        uVar3 = puVar1[3];
        puVar1[3] = 0;
        *(undefined8 *)((long)&(pCVar4->path).d.d + lVar12) = uVar3;
        uVar3 = puVar1[4];
        puVar1[4] = 0;
        *(undefined8 *)((long)&(pCVar4->path).d.ptr + lVar12) = uVar3;
        uVar3 = puVar1[5];
        puVar1[5] = 0;
        *(undefined8 *)((long)&(pCVar4->path).d.size + lVar12) = uVar3;
        lVar5 = lVar5 + 1;
        lVar12 = lVar12 + 0x30;
      } while ((ComponentInfo *)(puVar1 + 6) < pCVar7 + lVar11);
      goto LAB_0012d2eb;
    }
  }
  lVar5 = 0;
LAB_0012d2eb:
  pDVar6 = this->d;
  local_48.ptr = this->ptr;
  this->d = local_48.d;
  this->ptr = pCVar4;
  local_48.size = this->size;
  this->size = lVar5;
  local_48.d = pDVar6;
  ~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }